

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keylog.c
# Opt level: O2

_Bool Curl_tls_keylog_write(char *label,uchar *client_random,uchar *secret,size_t secretlen)

{
  byte bVar1;
  FILE *__stream;
  size_t __n;
  char *pcVar2;
  long lVar3;
  size_t sVar4;
  char line [195];
  char acStack_f8 [200];
  
  __stream = keylog_file_fp;
  if ((keylog_file_fp != (FILE *)0x0) &&
     (__n = strlen(label), 0xffffffffffffffcf < secretlen - 0x31 && __n < 0x20)) {
    memcpy(acStack_f8,label,__n);
    acStack_f8[__n] = ' ';
    pcVar2 = acStack_f8 + __n + 3;
    for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
      bVar1 = client_random[lVar3];
      pcVar2[-2] = "0123456789ABCDEF"[bVar1 >> 4];
      pcVar2[-1] = "0123456789ABCDEF"[bVar1 & 0xf];
      pcVar2 = pcVar2 + 2;
    }
    pcVar2[-2] = ' ';
    for (sVar4 = 0; secretlen != sVar4; sVar4 = sVar4 + 1) {
      bVar1 = secret[sVar4];
      pcVar2[sVar4 * 2 + -1] = "0123456789ABCDEF"[bVar1 >> 4];
      pcVar2[sVar4 * 2] = "0123456789ABCDEF"[bVar1 & 0xf];
    }
    (pcVar2 + sVar4 * 2 + -1)[0] = '\n';
    (pcVar2 + sVar4 * 2 + -1)[1] = '\0';
    fputs(acStack_f8,(FILE *)__stream);
    return true;
  }
  return false;
}

Assistant:

bool
Curl_tls_keylog_write(const char *label,
                      const unsigned char client_random[CLIENT_RANDOM_SIZE],
                      const unsigned char *secret, size_t secretlen)
{
  const char *hex = "0123456789ABCDEF";
  size_t pos, i;
  char line[KEYLOG_LABEL_MAXLEN + 1 + 2 * CLIENT_RANDOM_SIZE + 1 +
            2 * SECRET_MAXLEN + 1 + 1];

  if(!keylog_file_fp) {
    return false;
  }

  pos = strlen(label);
  if(pos > KEYLOG_LABEL_MAXLEN || !secretlen || secretlen > SECRET_MAXLEN) {
    /* Should never happen - sanity check anyway. */
    return false;
  }

  memcpy(line, label, pos);
  line[pos++] = ' ';

  /* Client Random */
  for(i = 0; i < CLIENT_RANDOM_SIZE; i++) {
    line[pos++] = hex[client_random[i] >> 4];
    line[pos++] = hex[client_random[i] & 0xF];
  }
  line[pos++] = ' ';

  /* Secret */
  for(i = 0; i < secretlen; i++) {
    line[pos++] = hex[secret[i] >> 4];
    line[pos++] = hex[secret[i] & 0xF];
  }
  line[pos++] = '\n';
  line[pos] = '\0';

  /* Using fputs here instead of fprintf since libcurl's fprintf replacement
     may not be thread-safe. */
  fputs(line, keylog_file_fp);
  return true;
}